

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O0

void list_engines(curl_slist *engines)

{
  curl_slist *local_10;
  curl_slist *engines_local;
  
  puts("Build-time engines:");
  local_10 = engines;
  if (engines == (curl_slist *)0x0) {
    puts("  <none>");
  }
  else {
    for (; local_10 != (curl_slist *)0x0; local_10 = local_10->next) {
      curl_mprintf("  %s\n",local_10->data);
    }
  }
  return;
}

Assistant:

void list_engines(const struct curl_slist *engines)
{
  puts("Build-time engines:");
  if(!engines) {
    puts("  <none>");
    return;
  }
  for(; engines; engines = engines->next)
    printf("  %s\n", engines->data);
}